

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O3

void benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>>
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *image,vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>
                       *filter,size_t num_channels,size_t num_filters,size_t image_size1,
               size_t image_size2,size_t filter_size)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ostream *poVar4;
  long lVar5;
  size_t i;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  matrix<double,_remora::row_major,_remora::cpu_tag> out;
  allocator_type local_99;
  size_t local_98;
  size_t local_90;
  double local_88;
  long local_80;
  long local_78;
  vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *local_70;
  double local_68;
  value_type_conflict1 local_60;
  long local_58;
  long local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_78 = (image_size1 - filter_size) + 1;
  local_80 = (image_size2 - filter_size) + 1;
  local_58 = *(long *)image;
  local_50 = local_78 * num_filters * local_80;
  local_60 = 0.0;
  local_98 = num_filters;
  local_90 = num_channels;
  local_70 = filter;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,local_50 * local_58,&local_60,&local_99);
  dVar7 = 1.79769313486232e+308;
  lVar6 = 0;
  do {
    local_88 = dVar7;
    local_68 = Timer::now(true);
    remora::bindings::
    conv2d<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
              (image,local_70,
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)&local_58,local_90,local_98,image_size1,image_size2,filter_size,filter_size,0,0);
    dVar8 = Timer::now(true);
    lVar5 = local_78;
    dVar7 = 0.0;
    if (0.0 <= dVar8 - local_68) {
      dVar7 = dVar8 - local_68;
    }
    if (local_88 <= dVar7) {
      dVar7 = local_88;
    }
    lVar6 = lVar6 + 1;
    uVar1 = *(ulong *)image;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    lVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x14)) / auVar2,0);
  } while (lVar6 != lVar3 + (ulong)(lVar3 == 0));
  local_88 = dVar7;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  lVar5 = filter_size * filter_size * local_80 * local_98 * local_90 * lVar5;
  auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar9._0_8_ = lVar5;
  auVar9._12_4_ = 0x45300000;
  auVar10._8_4_ = (int)(uVar1 >> 0x20);
  auVar10._0_8_ = uVar1;
  auVar10._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
                       ((auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625) / local_88);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void benchmark(
	matrix_expression<E1, cpu_tag> const& image,
	vector_expression<E2, cpu_tag> const& filter,
	std::size_t num_channels,
	std::size_t num_filters,
	std::size_t image_size1,
	std::size_t image_size2,
	std::size_t filter_size
){
	std::size_t output_size1 = image_size1 - filter_size +1;
	std::size_t output_size2 = image_size2 - filter_size +1;
	typedef typename E1::value_type value_type;

	remora::matrix<value_type> out(image().size1(), output_size1 * num_filters * output_size2, 0.0);
	double minOptTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != std::max<std::size_t>(1, std::size_t(20/image().size1())); ++i){
		Timer time;
		kernels::conv2d(image,filter,out, num_channels, num_filters, image_size1, image_size2, filter_size, filter_size,0,0);
		minOptTime = std::min(minOptTime,time.stop());
	}

	double mults = output_size1 * output_size2 * filter_size * filter_size * num_filters * num_channels;
	double flops = image().size1() * mults /1024/1024/minOptTime;

	std::cout<<output_size1<<"\t"<<filter_size<<"\t"<<num_channels<<"\t"<< num_filters<<"\t";
	std::cout<<"\t"<<flops<< std::endl;
}